

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,ScriptOperator *op_code)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  cfd::core::ByteData::ByteData(&this->data_);
  this->data_type_ = kOpCode;
  cfd::core::Pubkey::Pubkey(&this->related_pubkey_);
  this->der_encode_ = false;
  cfd::core::SigHashType::SigHashType(&this->sighash_type_);
  cfd::core::ScriptOperator::ScriptOperator(&this->op_code_,op_code);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&list,1,(allocator_type *)&local_38);
  *list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = (char)(this->op_code_).data_type_;
  cfd::core::ByteData::ByteData((ByteData *)&local_38,(vector *)&list);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

SignParameter::SignParameter(const ScriptOperator& op_code)
    : data_(),
      data_type_(SignDataType::kOpCode),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(op_code) {
  std::vector<uint8_t> list(1);
  list[0] = static_cast<uint8_t>(op_code_.GetDataType());
  data_ = ByteData(list);
}